

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O3

void __thiscall rtosc::helpers::Capture::map_blobs(Capture *this)

{
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_00;
  long lVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  rtosc_arg_val_t *prVar5;
  long lVar6;
  long lVar7;
  
  iVar3 = this->nargs;
  if (0 < iVar3) {
    lVar7 = 0;
    do {
      prVar5 = this->arg_vals;
      if (((prVar5[lVar7].type == 'b') && (prVar5[lVar7].val.b.data != (uint8_t *)0x0)) &&
         (prVar5[lVar7].val.i != 0)) {
        this_00 = this->scratch_bufs;
        std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::resize(this_00,(*(long *)(this_00 + 8) - *(long *)this_00 >> 3) * -0x5555555555555555 + 1)
        ;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)
                   (*(long *)(this->scratch_bufs + 8) + -0x18),(long)this->arg_vals[lVar7].val.i);
        prVar5 = this->arg_vals;
        if (0 < (long)prVar5[lVar7].val.i) {
          lVar1 = *(long *)(*(long *)(this->scratch_bufs + 8) + -0x18);
          puVar2 = prVar5[lVar7].val.b.data;
          uVar4 = (long)prVar5[lVar7].val.i + 1;
          lVar6 = 0;
          do {
            *(uint8_t *)(lVar1 + lVar6) = puVar2[lVar6];
            uVar4 = uVar4 - 1;
            lVar6 = lVar6 + 1;
          } while (1 < uVar4);
          prVar5 = this->arg_vals;
        }
        prVar5[lVar7].val.b.data = *(uint8_t **)(*(long *)(this->scratch_bufs + 8) + -0x18);
        iVar3 = this->nargs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar3);
  }
  return;
}

Assistant:

void map_blobs()
    {
        for(int i = 0; i < nargs; ++i)
        {
            if(arg_vals[i].type == 'b'
               && arg_vals[i].val.b.data && arg_vals[i].val.b.len)
            {
                scratch_bufs->resize(scratch_bufs->size()+1);
                scratch_bufs->back().resize(arg_vals[i].val.b.len);
                std::copy_n(arg_vals[i].val.b.data,
                            arg_vals[i].val.b.len,
                            scratch_bufs->back().begin());
                arg_vals[i].val.b.data = (uint8_t*)scratch_bufs->back().data();
            }
        }
    }